

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_number(element_t *element,int id,float *number,_Bool percent,_Bool inherit)

{
  _Bool _Var1;
  char *end_00;
  float local_50;
  float local_4c;
  char *end;
  char *it;
  string_t *value;
  _Bool inherit_local;
  float *pfStack_28;
  _Bool percent_local;
  float *number_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value._6_1_ = inherit;
  value._7_1_ = percent;
  pfStack_28 = number;
  number_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,inherit);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    _Var1 = parse_float(&end,end_00,pfStack_28);
    if (_Var1) {
      if ((value._7_1_ & 1) != 0) {
        _Var1 = skip_delim(&end,end_00,'%');
        if (_Var1) {
          *pfStack_28 = *pfStack_28 / 100.0;
        }
        if (0.0 < *pfStack_28 || *pfStack_28 == 0.0) {
          if (*pfStack_28 <= 1.0) {
            local_50 = *pfStack_28;
          }
          else {
            local_50 = 1.0;
          }
          local_4c = local_50;
        }
        else {
          local_4c = 0.0;
        }
        *pfStack_28 = local_4c;
      }
      element_local._7_1_ = true;
    }
    else {
      element_local._7_1_ = false;
    }
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_number(const element_t* element, int id, float* number, bool percent, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(!parse_float(&it, end, number))
        return false;
    if(percent) {
        if(skip_delim(&it, end, '%'))
            *number /= 100.f;
        *number = CLAMP(*number, 0.f, 1.f);
    }

    return true;
}